

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O1

bool flow::transform::eliminateUnusedInstr(IRHandler *handler)

{
  _List_node_base *p_Var1;
  long lVar2;
  long lVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  bool bVar6;
  bool local_49;
  undefined1 local_48 [16];
  _Alloc_hider local_38;
  
  p_Var4 = (handler->blocks_).
           super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_48._8_8_ = &handler->blocks_;
  local_49 = p_Var4 != (_List_node_base *)local_48._8_8_;
  if (local_49) {
    do {
      local_38._M_p = (pointer)p_Var4[1]._M_next;
      p_Var1 = *(_List_node_base **)((long)local_38._M_p + 0x50U + 8);
      for (p_Var5 = ((_List_node_base *)((long)local_38._M_p + 0x50))->_M_next;
          bVar6 = p_Var5 != p_Var1, bVar6; p_Var5 = (_List_node_base *)&p_Var5->_M_prev) {
        lVar2 = (long)p_Var5->_M_next;
        if (lVar2 == 0) {
          lVar3 = 0;
        }
        else {
          lVar3 = __dynamic_cast(lVar2,&Instr::typeinfo,&CallInstr::typeinfo,0);
        }
        if ((((lVar3 != 0) &&
             ((*(byte *)(*(long *)(**(long **)(lVar3 + 0x50) + 0x48) + 0x90) & 4) != 0)) &&
            (*(int *)(lVar2 + 8) != 0)) && (*(long *)(lVar2 + 0x30) == *(long *)(lVar2 + 0x38))) {
          BasicBlock::remove((BasicBlock *)local_48,local_38._M_p);
          if ((_func_int **)local_48._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_48._0_8_ + 8))();
          }
          local_48._0_8_ = (_func_int **)0x0;
          if (bVar6) {
            return local_49;
          }
          break;
        }
      }
      p_Var4 = p_Var4->_M_next;
      local_49 = p_Var4 != (_List_node_base *)local_48._8_8_;
    } while (local_49);
  }
  return local_49;
}

Assistant:

bool eliminateUnusedInstr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    for (Instr* instr : bb->instructions()) {
      if (auto f = dynamic_cast<CallInstr*>(instr)) {
        if (f->callee()->getNative().isReadOnly()) {
          if (instr->type() != LiteralType::Void && !instr->isUsed()) {
            bb->remove(instr);
            return true;
          }
        }
      }
    }
  }
  return false;
}